

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastBrOrCmEqDefinite
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool *pNeedHelper,bool isBranch,
          bool isInHelper)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar6;
  IntConstOpnd *testSrc2;
  BranchInstr *pBVar7;
  Opnd *pOVar8;
  Opnd *pOVar9;
  byte local_12a;
  bool local_129;
  LabelInstr *local_128;
  LabelInstr *local_120;
  Opnd *local_118;
  Opnd *local_110;
  bool local_105;
  byte local_d9;
  BranchInstr *branch_2;
  BranchInstr *branch_1;
  Opnd *likelyFlags;
  IndirOpnd *likelyType;
  RegOpnd *likelyTypeReg;
  BranchInstr *local_a8;
  BranchInstr *branch;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_98;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_96;
  byte local_93;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_92;
  bool isEqual;
  Opnd *pOStack_90;
  Opnd *likelySrc;
  Opnd *local_80;
  Opnd *definiteSrc;
  LibraryValue failureValueType;
  LibraryValue successValueType;
  LabelInstr *labelHelper;
  LabelInstr *labelFallThrough;
  LabelInstr *labelBranchFailure;
  LabelInstr *labelBranchSuccess;
  Opnd *local_48;
  Opnd *src2;
  Opnd *src1;
  bool isInHelper_local;
  bool *pbStack_30;
  bool isBranch_local;
  bool *pNeedHelper_local;
  Instr *pIStack_20;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  src1._6_1_ = isInHelper;
  src1._7_1_ = isBranch;
  pbStack_30 = pNeedHelper;
  pNeedHelper_local._4_4_ = helperMethod;
  pIStack_20 = instr;
  instr_local = (Instr *)this;
  src2 = IR::Instr::GetSrc1(instr);
  local_48 = IR::Instr::GetSrc2(pIStack_20);
  labelBranchSuccess._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(src2);
  bVar2 = ValueType::IsDefinite((ValueType *)((long)&labelBranchSuccess + 6));
  local_d9 = 0;
  if (!bVar2) {
    labelBranchSuccess._4_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(local_48);
    bVar2 = ValueType::IsDefinite((ValueType *)((long)&labelBranchSuccess + 4));
    local_d9 = bVar2 ^ 0xff;
  }
  if ((local_d9 & 1) == 0) {
    bVar2 = IR::Opnd::IsEqual(src2,local_48);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      labelBranchSuccess._2_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(src2);
      bVar2 = ValueType::IsDefinite((ValueType *)((long)&labelBranchSuccess + 2));
      local_105 = false;
      if (bVar2) {
        labelBranchSuccess._0_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(local_48);
        local_105 = ValueType::IsDefinite((ValueType *)&labelBranchSuccess);
      }
      if ((local_105 == false) ||
         ((bVar2 = IR::Opnd::IsTaggedValue(src2), !bVar2 &&
          (bVar2 = IR::Opnd::IsTaggedValue(local_48), !bVar2)))) {
        labelBranchFailure = (LabelInstr *)0x0;
        labelFallThrough = (LabelInstr *)0x0;
        labelHelper = IR::Instr::GetOrCreateContinueLabel(pIStack_20,false);
        _failureValueType = IR::LabelInstr::New(Label,this->m_func,(bool)(src1._6_1_ & 1));
        definiteSrc._4_4_ = ValueInvalid;
        definiteSrc._0_4_ = ValueInvalid;
        likelySrc._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(src2);
        bVar2 = ValueType::IsDefinite((ValueType *)((long)&likelySrc + 6));
        if (bVar2) {
          local_110 = src2;
        }
        else {
          local_110 = local_48;
        }
        local_80 = local_110;
        local_92.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(src2);
        bVar2 = ValueType::IsDefinite((ValueType *)&local_92.field_0);
        if (bVar2) {
          local_118 = local_48;
        }
        else {
          local_118 = src2;
        }
        pOStack_90 = local_118;
        bVar2 = IR::Instr::IsNeq(pIStack_20);
        local_93 = (bVar2 ^ 0xffU) & 1;
        if ((src1._7_1_ & 1) == 0) {
          labelBranchFailure = IR::LabelInstr::New(Label,this->m_func,false);
          labelFallThrough = IR::LabelInstr::New(Label,this->m_func,false);
          definiteSrc._4_4_ = ValueFalse;
          if ((local_93 & 1) != 0) {
            definiteSrc._4_4_ = ValueTrue;
          }
          definiteSrc._0_4_ = ValueTrue;
          if ((local_93 & 1) != 0) {
            definiteSrc._0_4_ = ValueFalse;
          }
        }
        else {
          if (local_93 == 0) {
            local_120 = labelHelper;
          }
          else {
            pBVar7 = IR::Instr::AsBranchInstr(pIStack_20);
            local_120 = IR::BranchInstr::GetTarget(pBVar7);
          }
          labelBranchFailure = local_120;
          if ((local_93 & 1) == 0) {
            pBVar7 = IR::Instr::AsBranchInstr(pIStack_20);
            local_128 = IR::BranchInstr::GetTarget(pBVar7);
          }
          else {
            local_128 = labelHelper;
          }
          labelFallThrough = local_128;
        }
        bVar2 = IR::Opnd::IsRegOpnd(pOStack_90);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x5d93,"(likelySrc->IsRegOpnd())","likelySrc->IsRegOpnd()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        local_96.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(local_80);
        bVar2 = ValueType::IsAnyArray((ValueType *)&local_96.field_0);
        local_129 = true;
        if (!bVar2) {
          local_98.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(local_80);
          bVar2 = ValueType::IsSymbol((ValueType *)&local_98.field_0);
          local_129 = true;
          if (!bVar2) {
            branch._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                           IR::Opnd::GetValueType(local_80);
            bVar2 = ValueType::IsBoolean((ValueType *)((long)&branch + 6));
            local_129 = true;
            if (!bVar2) {
              branch._4_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0
                              )IR::Opnd::GetValueType(local_80);
              local_129 = ValueType::IsPrimitiveOrObject((ValueType *)((long)&branch + 4));
            }
          }
        }
        if (local_129 == false) {
          likelyTypeReg._6_2_ =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(local_80);
          bVar2 = ValueType::IsObject((ValueType *)((long)&likelyTypeReg + 6));
          local_12a = 0;
          if (bVar2) {
            local_12a = DAT_01ea417f ^ 0xff;
          }
          if ((local_12a & 1) == 0) {
            bVar2 = IR::Opnd::IsTaggedInt(local_80);
            if (!bVar2) {
              return true;
            }
            InsertCompareBranch(this,src2,local_48,BrEq_A,labelBranchFailure,pIStack_20,false);
            pBVar7 = IR::BranchInstr::New(JMP,_failureValueType,this->m_func);
            IR::Instr::InsertBefore(pIStack_20,&pBVar7->super_Instr);
          }
          else {
            InsertCompareBranch(this,src2,local_48,BrEq_A,labelBranchFailure,pIStack_20,false);
            likelyTypeReg._4_2_ =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 IR::Opnd::GetValueType(pOStack_90);
            bVar2 = ValueType::IsDefinite((ValueType *)((long)&likelyTypeReg + 4));
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              *pbStack_30 = false;
            }
            else {
              pRVar5 = IR::Opnd::AsRegOpnd(pOStack_90);
              LowererMD::GenerateObjectTest
                        (&this->m_lowererMD,&pRVar5->super_Opnd,pIStack_20,labelFallThrough,false);
              pRVar5 = IR::RegOpnd::New(TyInt64,this->m_func);
              baseOpnd = IR::Opnd::AsRegOpnd(pOStack_90);
              uVar3 = Js::RecyclableObject::GetOffsetOfType();
              pIVar6 = IR::IndirOpnd::New(baseOpnd,uVar3,TyInt64,this->m_func,false);
              InsertMove(&pRVar5->super_Opnd,&pIVar6->super_Opnd,pIStack_20,true);
              uVar3 = Js::Type::GetOffsetOfFlags();
              pIVar6 = IR::IndirOpnd::New(pRVar5,uVar3,TyInt8,this->m_func,false);
              testSrc2 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,false);
              InsertTestBranch(&pIVar6->super_Opnd,&testSrc2->super_Opnd,BrNeq_A,_failureValueType,
                               pIStack_20);
            }
            pBVar7 = IR::BranchInstr::New(JMP,labelFallThrough,this->m_func);
            IR::Instr::InsertBefore(pIStack_20,&pBVar7->super_Instr);
          }
        }
        else {
          InsertCompareBranch(this,src2,local_48,BrEq_A,labelBranchFailure,pIStack_20,false);
          local_a8 = IR::BranchInstr::New(JMP,labelFallThrough,this->m_func);
          IR::Instr::InsertBefore(pIStack_20,&local_a8->super_Instr);
          *pbStack_30 = false;
        }
        if ((src1._7_1_ & 1) == 0) {
          IR::Instr::InsertBefore(pIStack_20,&labelBranchFailure->super_Instr);
          pOVar8 = IR::Instr::GetDst(pIStack_20);
          pOVar9 = LoadLibraryValueOpnd(this,pIStack_20,definiteSrc._4_4_);
          InsertMove(pOVar8,pOVar9,pIStack_20,true);
          InsertBranch(Br,labelHelper,pIStack_20);
          IR::Instr::InsertBefore(pIStack_20,&labelFallThrough->super_Instr);
          pOVar8 = IR::Instr::GetDst(pIStack_20);
          pOVar9 = LoadLibraryValueOpnd(this,pIStack_20,(LibraryValue)definiteSrc);
          InsertMove(pOVar8,pOVar9,pIStack_20,true);
          InsertBranch(Br,labelHelper,pIStack_20);
        }
        IR::Instr::InsertBefore(pIStack_20,&_failureValueType->super_Instr);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Lowerer::GenerateFastBrOrCmEqDefinite(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool *pNeedHelper, bool isBranch, bool isInHelper)
{
    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    if (!src1->GetValueType().IsDefinite() && !src2->GetValueType().IsDefinite())
    {
        return false;
    }
    if (src1->IsEqual(src2))
    {
        return false;
    }
    if (src1->GetValueType().IsDefinite() && src2->GetValueType().IsDefinite())
    {
        if (src1->IsTaggedValue() || src2->IsTaggedValue())
        {
            return true;
        }
    }

    IR::LabelInstr * labelBranchSuccess = nullptr;
    IR::LabelInstr * labelBranchFailure = nullptr;
    IR::LabelInstr * labelFallThrough = instr->GetOrCreateContinueLabel();
    IR::LabelInstr * labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);

    LibraryValue successValueType = ValueInvalid;
    LibraryValue failureValueType = ValueInvalid;

    IR::Opnd * definiteSrc = src1->GetValueType().IsDefinite() ? src1 : src2;
    IR::Opnd * likelySrc = src1->GetValueType().IsDefinite() ? src2 : src1;

    bool isEqual = !instr->IsNeq();

    if (!isBranch)
    {
        labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
        labelBranchFailure = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
        successValueType = isEqual ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
        failureValueType = isEqual ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;
    }
    else
    {
        labelBranchSuccess = isEqual ? instr->AsBranchInstr()->GetTarget() : labelFallThrough;
        labelBranchFailure = isEqual ? labelFallThrough : instr->AsBranchInstr()->GetTarget();
    }

    Assert(likelySrc->IsRegOpnd());

    if (definiteSrc->GetValueType().IsAnyArray() || definiteSrc->GetValueType().IsSymbol() || definiteSrc->GetValueType().IsBoolean() || definiteSrc->GetValueType().IsPrimitiveOrObject())
    {
        InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);
        IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchFailure, this->m_func);
        instr->InsertBefore(branch);
        *pNeedHelper = false;
    }
    else if (definiteSrc->GetValueType().IsObject() && !CONFIG_FLAG(ESBigInt))
    {
        InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);

        if (!likelySrc->GetValueType().IsDefinite())
        {
            m_lowererMD.GenerateObjectTest(likelySrc->AsRegOpnd(), instr, labelBranchFailure);
            IR::RegOpnd * likelyTypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            IR::IndirOpnd * likelyType = IR::IndirOpnd::New(likelySrc->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
            Lowerer::InsertMove(likelyTypeReg, likelyType, instr);
            IR::Opnd *likelyFlags = IR::IndirOpnd::New(likelyTypeReg, Js::Type::GetOffsetOfFlags(), TyInt8, this->m_func);
            InsertTestBranch(likelyFlags, IR::IntConstOpnd::New(TypeFlagMask_EngineExternal, TyInt8, this->m_func), Js::OpCode::BrNeq_A, labelHelper, instr);
        }
        else
        {
            *pNeedHelper = false;
        }

        IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchFailure, this->m_func);
        instr->InsertBefore(branch);
    }
    else if (definiteSrc->IsTaggedInt())
    {
        InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);
        IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func);
        instr->InsertBefore(branch);
    }
    else
    {
        return true;
    }

    if (!isBranch)
    {
        instr->InsertBefore(labelBranchSuccess);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallThrough, instr);

        instr->InsertBefore(labelBranchFailure);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, failureValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallThrough, instr);
    }

    instr->InsertBefore(labelHelper);

    return true;
}